

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall foxxll::disk_config::parse_line(disk_config *this,string *line)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  bool bVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmfield;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  eqfield;
  int pid;
  ostringstream msg;
  
  tlx::split(&eqfield,'=',line,2,2);
  bVar1 = std::operator==(eqfield.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,"disk");
  if (bVar1) {
    bVar5 = false;
  }
  else {
    bVar1 = std::operator==(eqfield.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"flash");
    bVar5 = true;
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      poVar3 = std::operator<<((ostream *)&msg,"Error in ");
      poVar3 = std::operator<<(poVar3,"void foxxll::disk_config::parse_line(const std::string &)");
      poVar3 = std::operator<<(poVar3," : ");
      poVar3 = std::operator<<(poVar3,"Unknown configuration token ");
      std::operator<<(poVar3,(string *)
                             eqfield.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&pid);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  this->flash = bVar5;
  this->autogrow = true;
  this->delete_on_exit = false;
  this->direct = DIRECT_TRY;
  this->queue = -1;
  this->device_id = 0xffffffff;
  this->unlink_on_open = false;
  tlx::split(&cmfield,',',
             eqfield.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,3,3);
  tlx::expand_environment_variables
            ((string *)&msg,
             cmfield.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::operator=((string *)this,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  uVar2 = std::__cxx11::string::find((char *)this,0x153299);
  if (uVar2 != 0xffffffffffffffff) {
    pid = getpid();
    to_str<int>((string *)&msg,&pid);
    std::__cxx11::string::replace((ulong)this,uVar2,(string *)0x3);
    std::__cxx11::string::~string((string *)&msg);
  }
  bVar1 = tlx::parse_si_iec_units
                    (cmfield.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1,&this->size,'M');
  if (bVar1) {
    if (this->size == 0) {
      this->autogrow = true;
      this->delete_on_exit = true;
    }
    std::__cxx11::string::_M_assign((string *)&this->io_impl);
    parse_fileio(this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cmfield);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&eqfield);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar3 = std::operator<<((ostream *)&msg,"Error in ");
  poVar3 = std::operator<<(poVar3,"void foxxll::disk_config::parse_line(const std::string &)");
  poVar3 = std::operator<<(poVar3," : ");
  poVar3 = std::operator<<(poVar3,"Invalid disk size \'");
  poVar3 = std::operator<<(poVar3,(string *)
                                  (cmfield.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  std::operator<<(poVar3,"\' in disk configuration file.");
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,(string *)&pid);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void disk_config::parse_line(const std::string& line)
{
    // split off disk= or flash=
    std::vector<std::string> eqfield = tlx::split('=', line, 2, 2);

    if (eqfield[0] == "disk") {
        flash = false;
    }
    else if (eqfield[0] == "flash") {
        flash = true;
    }
    else {
        FOXXLL_THROW(
            std::runtime_error,
            "Unknown configuration token " << eqfield[0]
        );
    }

    // *** Set Default Extra Options ***

    autogrow = true; // was default for a long time, have to keep it this way
    delete_on_exit = false;
    direct = DIRECT_TRY;
    // flash is already set
    queue = file::DEFAULT_QUEUE;
    device_id = file::DEFAULT_DEVICE_ID;
    unlink_on_open = false;

    // *** Save Basic Options ***

    // split at commands, at least 3 fields
    std::vector<std::string> cmfield = tlx::split(',', eqfield[1], 3, 3);

    // path:
    path = tlx::expand_environment_variables(cmfield[0]);
    // replace $$ -> pid in path
    {
        std::string::size_type pos;
        if ((pos = path.find("$$")) != std::string::npos)
        {
#if !FOXXLL_WINDOWS
            int pid = getpid();
#else
            DWORD pid = GetCurrentProcessId();
#endif
            path.replace(pos, 3, to_str(pid));
        }
    }

    // size: (default unit MiB)
    if (!tlx::parse_si_iec_units(cmfield[1], &size, 'M')) {
        FOXXLL_THROW(
            std::runtime_error,
            "Invalid disk size '" << cmfield[1] << "' in disk configuration file."
        );
    }

    if (size == 0) {
        autogrow = true;
        delete_on_exit = true;
    }

    // io_impl:
    io_impl = cmfield[2];
    parse_fileio();
}